

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_importMultipleUnitsFromSameDocumentWithSameUnitsDependency_Test::
~Units_importMultipleUnitsFromSameDocumentWithSameUnitsDependency_Test
          (Units_importMultipleUnitsFromSameDocumentWithSameUnitsDependency_Test *this)

{
  Units_importMultipleUnitsFromSameDocumentWithSameUnitsDependency_Test *this_local;
  
  ~Units_importMultipleUnitsFromSameDocumentWithSameUnitsDependency_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, importMultipleUnitsFromSameDocumentWithSameUnitsDependency)
{
    libcellml::ModelPtr unitsModel = libcellml::Model::create("Units_Database");
    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::UnitsPtr u1 = libcellml::Units::create("fmol");
    u1->addUnit("mole", "femto");
    libcellml::UnitsPtr u2 = libcellml::Units::create("per_fmol");
    u2->addUnit("fmol", -1.0);

    libcellml::UnitsPtr iu1 = libcellml::Units::create("fmol");
    libcellml::UnitsPtr iu2 = libcellml::Units::create("per_fmol");

    unitsModel->addUnits(u1);
    unitsModel->addUnits(u2);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");
    import->setModel(unitsModel);

    iu1->setImportSource(import);
    iu1->setImportReference("fmol");
    iu2->setImportSource(import);
    iu2->setImportReference("per_fmol");

    model->addUnits(iu1);
    model->addUnits(iu2);

    EXPECT_FALSE(model->hasUnresolvedImports());

    libcellml::ImporterPtr i = libcellml::Importer::create();

    auto flatModel = i->flattenModel(model);

    EXPECT_EQ(size_t(2), flatModel->unitsCount());
    EXPECT_EQ("fmol", flatModel->units(0)->name());
    EXPECT_EQ("per_fmol", flatModel->units(1)->name());
}